

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O1

void __thiscall
ConfidentialTransaction_SetIssuance_Test::TestBody(ConfidentialTransaction_SetIssuance_Test *this)

{
  ByteData256 BVar1;
  ByteData256 BVar2;
  ConfidentialValue CVar3;
  ConfidentialValue CVar4;
  ByteData BVar5;
  bool bVar6;
  AssertHelperData *pAVar7;
  ulong uVar8;
  size_t sVar9;
  char *pcVar10;
  uint in_stack_fffffffffffffbd8;
  uint uVar11;
  undefined4 in_stack_fffffffffffffbdc;
  undefined4 uVar12;
  pointer in_stack_fffffffffffffbe0;
  undefined1 in_stack_fffffffffffffbe8 [16];
  AssertionResult gtest_ar_2;
  AssertHelper local_3f8;
  AssertHelperData *pAStack_3f0;
  long local_3e8;
  char *pcStack_3e0;
  AssertionResult gtest_ar;
  undefined1 local_3c8 [16];
  undefined8 in_stack_fffffffffffffc48;
  uint32_t in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc54 [12];
  _Vector_impl_data in_stack_fffffffffffffc60;
  uint32_t local_370;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_360;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_348;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_330;
  ConfidentialValue CStack_318;
  ConfidentialValue CStack_2f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_2c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_2b0;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> vStack_290;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_278;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_260;
  ConfidentialValue local_248;
  ConfidentialValue local_220;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1e0;
  ConfidentialTxInReference txin;
  ConfidentialTransaction tx;
  
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&tx,(string *)&exp_tx_hex_abi_cxx11_);
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      cfd::core::ConfidentialTransaction::AddTxIn((Txid *)&tx,0x4fbee8,2,(Script *)0xfffffffe);
    }
  }
  else {
    testing::Message::Message((Message *)&txin);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xff,
               "Expected: (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&txin);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if (txin.super_AbstractTxInReference._vptr_AbstractTxInReference != (_func_int **)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) &&
         (txin.super_AbstractTxInReference._vptr_AbstractTxInReference != (_func_int **)0x0)) {
        (**(code **)(*txin.super_AbstractTxInReference._vptr_AbstractTxInReference + 8))();
      }
      txin.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x0;
    }
  }
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_260,&exp_blinding_nonce.data_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_278,&exp_asset_entropy.data_);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_220,&exp_issuance_amount);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_248,&exp_inflation_keys);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_1e0,&exp_issuance_amount_rangeproof.data_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_1f8,&exp_inflation_keys_rangeproof.data_);
      BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&local_1f8;
      BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_1e0;
      BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_fffffffffffffbd8;
      BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = in_stack_fffffffffffffbdc;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffbe8._0_8_;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffbe8._8_8_;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = in_stack_fffffffffffffbe0;
      CVar3._vptr_ConfidentialValue._1_7_ = gtest_ar_2._1_7_;
      CVar3._vptr_ConfidentialValue._0_1_ = gtest_ar_2.success_;
      CVar3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)gtest_ar_2.message_.ptr_;
      CVar3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_3f8.data_;
      CVar3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pAStack_3f0;
      CVar3._32_8_ = local_3e8;
      CVar4.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = gtest_ar.success_;
      CVar4._vptr_ConfidentialValue = (_func_int **)pcStack_3e0;
      CVar4.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._1_7_ = gtest_ar._1_7_;
      CVar4.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)gtest_ar.message_.ptr_;
      CVar4.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_3c8._0_8_;
      CVar4.version_ = local_3c8[8];
      CVar4._33_7_ = local_3c8._9_7_;
      BVar5.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffffc50;
      BVar5.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffc48;
      BVar5.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._12_12_ = in_stack_fffffffffffffc54;
      cfd::core::ConfidentialTransaction::SetIssuance
                ((uint)&tx,BVar1,BVar2,CVar3,CVar4,BVar5,(ByteData)in_stack_fffffffffffffc60);
      if (local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      local_248._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_004f2f10;
      if (local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_248.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_220._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_004f2f10;
      if (local_220.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_220.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_260.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&txin);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x105,
               "Expected: (tx.SetIssuance(index, exp_blinding_nonce, exp_asset_entropy, exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof, exp_inflation_keys_rangeproof)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&txin);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if (txin.super_AbstractTxInReference._vptr_AbstractTxInReference != (_func_int **)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) &&
         (txin.super_AbstractTxInReference._vptr_AbstractTxInReference != (_func_int **)0x0)) {
        (**(code **)(*txin.super_AbstractTxInReference._vptr_AbstractTxInReference + 8))();
      }
      txin.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x0;
    }
  }
  cfd::core::ConfidentialTxInReference::ConfidentialTxInReference(&txin);
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      cfd::core::ConfidentialTransaction::GetTxIn((uint)&gtest_ar);
      cfd::core::Txid::operator=(&txin.super_AbstractTxInReference.txid_,(Txid *)&gtest_ar.message_)
      ;
      txin.super_AbstractTxInReference.vout_ = in_stack_fffffffffffffc50;
      cfd::core::Script::operator=
                (&txin.super_AbstractTxInReference.unlocking_script_,
                 (Script *)&stack0xfffffffffffffc58);
      txin.super_AbstractTxInReference.sequence_ = local_370;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&txin.super_AbstractTxInReference.script_witness_.witness_stack_,&local_360);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&txin.blinding_nonce_.data_,&vStack_348);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&txin.asset_entropy_.data_,&vStack_330);
      cfd::core::ConfidentialValue::operator=(&txin.issuance_amount_,&CStack_318);
      cfd::core::ConfidentialValue::operator=(&txin.inflation_keys_,&CStack_2f0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&txin.issuance_amount_rangeproof_.data_,&vStack_2c8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&txin.inflation_keys_rangeproof_.data_,&vStack_2b0);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&txin.pegin_witness_.witness_stack_,&vStack_290);
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x108,
               "Expected: (txin = tx.GetTxIn(1)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbd8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbd8);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin.GetVout()","exp_index",(uint *)&stack0xfffffffffffffbd8,
             &exp_index);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&stack0xfffffffffffffbd8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x10a,pcVar10);
    testing::internal::AssertHelper::operator=(&local_3f8,(Message *)&stack0xfffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f8);
    if (CONCAT44(in_stack_fffffffffffffbdc,txin.super_AbstractTxInReference.vout_) != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) &&
         ((long *)CONCAT44(in_stack_fffffffffffffbdc,txin.super_AbstractTxInReference.vout_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffffbdc,
                                       txin.super_AbstractTxInReference.vout_) + 8))();
      }
      in_stack_fffffffffffffbdc = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin.GetSequence()","exp_sequence",
             (uint *)&stack0xfffffffffffffbd8,&exp_sequence);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&stack0xfffffffffffffbd8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x10b,pcVar10);
    testing::internal::AssertHelper::operator=(&local_3f8,(Message *)&stack0xfffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f8);
    if (((CONCAT44(in_stack_fffffffffffffbdc,txin.super_AbstractTxInReference.sequence_) != 0) &&
        (bVar6 = testing::internal::IsTrue(true), bVar6)) &&
       ((long *)CONCAT44(in_stack_fffffffffffffbdc,txin.super_AbstractTxInReference.sequence_) !=
        (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffffbdc,
                                     txin.super_AbstractTxInReference.sequence_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Txid::Txid((Txid *)&stack0xfffffffffffffbd8,&txin.super_AbstractTxInReference.txid_);
  cfd::core::Txid::GetHex_abi_cxx11_();
  pcVar10 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::Txid::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",
             pcVar10,(char *)local_3f8.data_);
  if (local_3f8.data_ != (AssertHelperData *)&local_3e8) {
    operator_delete(local_3f8.data_);
  }
  if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_3c8) {
    operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  uVar11 = 0x4deb78;
  uVar12 = 0;
  if (in_stack_fffffffffffffbe0 != (pointer)0x0) {
    operator_delete(in_stack_fffffffffffffbe0);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x10c,pcVar10);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbd8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbd8);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script((Script *)&gtest_ar,&txin.super_AbstractTxInReference.unlocking_script_)
  ;
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar10 = (char *)CONCAT44(uVar12,uVar11);
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetUnlockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",pcVar10,(char *)local_3f8.data_);
  if (local_3f8.data_ != (AssertHelperData *)&local_3e8) {
    operator_delete(local_3f8.data_);
  }
  if ((undefined1 *)CONCAT44(uVar12,uVar11) != &stack0xfffffffffffffbe8) {
    operator_delete((undefined1 *)CONCAT44(uVar12,uVar11));
  }
  cfd::core::Script::~Script((Script *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x10e,pcVar10);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbd8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbd8);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3f8.data_ = (AssertHelperData *)0x0;
  pAStack_3f0 = (AssertHelperData *)0x0;
  local_3e8 = 0;
  uVar8 = (long)txin.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txin.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pAVar7 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar7 = (AssertHelperData *)operator_new(uVar8);
  }
  local_3e8 = uVar8 + (long)pAVar7;
  sVar9 = (long)txin.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txin.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_3f8.data_ = pAVar7;
  if (sVar9 != 0) {
    pAStack_3f0 = pAVar7;
    memmove(pAVar7,txin.blinding_nonce_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  pAStack_3f0 = (AssertHelperData *)((long)pAVar7 + sVar9);
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  pcVar10 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetBlindingNonce().GetHex().c_str()",
             "exp_blinding_nonce.GetHex().c_str()",pcVar10,(char *)CONCAT44(uVar12,uVar11));
  if ((undefined1 *)CONCAT44(uVar12,uVar11) != &stack0xfffffffffffffbe8) {
    operator_delete((undefined1 *)CONCAT44(uVar12,uVar11));
  }
  if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_3c8) {
    operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  if (local_3f8.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_3f8.data_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x110,pcVar10);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbd8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbd8);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3f8.data_ = (AssertHelperData *)0x0;
  pAStack_3f0 = (AssertHelperData *)0x0;
  local_3e8 = 0;
  uVar8 = (long)txin.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txin.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pAVar7 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar7 = (AssertHelperData *)operator_new(uVar8);
  }
  local_3e8 = uVar8 + (long)pAVar7;
  sVar9 = (long)txin.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txin.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_3f8.data_ = pAVar7;
  if (sVar9 != 0) {
    pAStack_3f0 = pAVar7;
    memmove(pAVar7,txin.asset_entropy_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  pAStack_3f0 = (AssertHelperData *)((long)pAVar7 + sVar9);
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  pcVar10 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetAssetEntropy().GetHex().c_str()",
             "exp_asset_entropy.GetHex().c_str()",pcVar10,(char *)CONCAT44(uVar12,uVar11));
  if ((undefined1 *)CONCAT44(uVar12,uVar11) != &stack0xfffffffffffffbe8) {
    operator_delete((undefined1 *)CONCAT44(uVar12,uVar11));
  }
  if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_3c8) {
    operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  if (local_3f8.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_3f8.data_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x112,pcVar10);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbd8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbd8);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&gtest_ar,&txin.issuance_amount_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  pcVar10 = (char *)CONCAT44(uVar12,uVar11);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetIssuanceAmount().GetHex().c_str()",
             "exp_issuance_amount.GetHex().c_str()",pcVar10,(char *)local_3f8.data_);
  if (local_3f8.data_ != (AssertHelperData *)&local_3e8) {
    operator_delete(local_3f8.data_);
  }
  if ((undefined1 *)CONCAT44(uVar12,uVar11) != &stack0xfffffffffffffbe8) {
    operator_delete((undefined1 *)CONCAT44(uVar12,uVar11));
  }
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0x4f2f;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x114,pcVar10);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbd8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbd8);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&gtest_ar,&txin.inflation_keys_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  pcVar10 = (char *)CONCAT44(uVar12,uVar11);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetInflationKeys().GetHex().c_str()",
             "exp_inflation_keys.GetHex().c_str()",pcVar10,(char *)local_3f8.data_);
  if (local_3f8.data_ != (AssertHelperData *)&local_3e8) {
    operator_delete(local_3f8.data_);
  }
  if ((undefined1 *)CONCAT44(uVar12,uVar11) != &stack0xfffffffffffffbe8) {
    operator_delete((undefined1 *)CONCAT44(uVar12,uVar11));
  }
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0x4f2f;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x116,pcVar10);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbd8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbd8);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3f8.data_ = (AssertHelperData *)0x0;
  pAStack_3f0 = (AssertHelperData *)0x0;
  local_3e8 = 0;
  uVar8 = (long)txin.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txin.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pAVar7 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar7 = (AssertHelperData *)operator_new(uVar8);
  }
  local_3e8 = uVar8 + (long)pAVar7;
  sVar9 = (long)txin.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txin.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_3f8.data_ = pAVar7;
  if (sVar9 != 0) {
    pAStack_3f0 = pAVar7;
    memmove(pAVar7,txin.issuance_amount_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  pAStack_3f0 = (AssertHelperData *)((long)pAVar7 + sVar9);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar10 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetIssuanceAmountRangeproof().GetHex().c_str()",
             "exp_issuance_amount_rangeproof.GetHex().c_str()",pcVar10,
             (char *)CONCAT44(uVar12,uVar11));
  if ((undefined1 *)CONCAT44(uVar12,uVar11) != &stack0xfffffffffffffbe8) {
    operator_delete((undefined1 *)CONCAT44(uVar12,uVar11));
  }
  if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_3c8) {
    operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  if (local_3f8.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_3f8.data_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x118,pcVar10);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbd8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbd8);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3f8.data_ = (AssertHelperData *)0x0;
  pAStack_3f0 = (AssertHelperData *)0x0;
  local_3e8 = 0;
  uVar8 = (long)txin.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txin.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pAVar7 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar7 = (AssertHelperData *)operator_new(uVar8);
  }
  local_3e8 = uVar8 + (long)pAVar7;
  sVar9 = (long)txin.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txin.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_3f8.data_ = pAVar7;
  if (sVar9 != 0) {
    pAStack_3f0 = pAVar7;
    memmove(pAVar7,txin.inflation_keys_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  pAStack_3f0 = (AssertHelperData *)((long)pAVar7 + sVar9);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar10 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetInflationKeysRangeproof().GetHex().c_str()",
             "exp_inflation_keys_rangeproof.GetHex().c_str()",pcVar10,
             (char *)CONCAT44(uVar12,uVar11));
  if ((undefined1 *)CONCAT44(uVar12,uVar11) != &stack0xfffffffffffffbe8) {
    operator_delete((undefined1 *)CONCAT44(uVar12,uVar11));
  }
  if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_3c8) {
    operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  if (local_3f8.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_3f8.data_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x11a,pcVar10);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbd8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbd8);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&txin);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&tx);
  return;
}

Assistant:

TEST(ConfidentialTransaction, SetIssuance) {
  ConfidentialTransaction tx(exp_tx_hex);
  uint32_t index = 0;
  EXPECT_NO_THROW(
      (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)));

  EXPECT_NO_THROW(
      (tx.SetIssuance(index, exp_blinding_nonce, exp_asset_entropy,
                      exp_issuance_amount, exp_inflation_keys,
                      exp_issuance_amount_rangeproof,
                      exp_inflation_keys_rangeproof)));

  ConfidentialTxInReference txin;
  EXPECT_NO_THROW((txin = tx.GetTxIn(1)));

  EXPECT_EQ(txin.GetVout(), exp_index);
  EXPECT_EQ(txin.GetSequence(), exp_sequence);
  EXPECT_STREQ(txin.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
  EXPECT_STREQ(txin.GetUnlockingScript().GetHex().c_str(),
               exp_script.GetHex().c_str());
  EXPECT_STREQ(txin.GetBlindingNonce().GetHex().c_str(),
               exp_blinding_nonce.GetHex().c_str());
  EXPECT_STREQ(txin.GetAssetEntropy().GetHex().c_str(),
               exp_asset_entropy.GetHex().c_str());
  EXPECT_STREQ(txin.GetIssuanceAmount().GetHex().c_str(),
               exp_issuance_amount.GetHex().c_str());
  EXPECT_STREQ(txin.GetInflationKeys().GetHex().c_str(),
               exp_inflation_keys.GetHex().c_str());
  EXPECT_STREQ(txin.GetIssuanceAmountRangeproof().GetHex().c_str(),
               exp_issuance_amount_rangeproof.GetHex().c_str());
  EXPECT_STREQ(txin.GetInflationKeysRangeproof().GetHex().c_str(),
               exp_inflation_keys_rangeproof.GetHex().c_str());
}